

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_stream.hpp
# Opt level: O3

bool __thiscall
cfgfile::input_stream_t<cfgfile::string_trait_t>::is_new_line
          (input_stream_t<cfgfile::string_trait_t> *this,char_t *ch)

{
  iterator *piVar1;
  char_t *pcVar2;
  bool bVar3;
  char_t local_19;
  
  bVar3 = true;
  if (*ch != const_t<cfgfile::string_trait_t>::c_carriage_return) {
    if (*ch == const_t<cfgfile::string_trait_t>::c_line_feed) {
      local_19 = simple_get(this);
      if (local_19 == const_t<cfgfile::string_trait_t>::c_carriage_return) {
        *ch = local_19;
      }
      else {
        pcVar2 = (this->m_returned_char).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (pcVar2 == (this->m_returned_char).c.super__Deque_base<char,_std::allocator<char>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<char,std::allocator<char>>::_M_push_back_aux<char_const&>
                    ((deque<char,std::allocator<char>> *)&this->m_returned_char,&local_19);
        }
        else {
          *pcVar2 = local_19;
          piVar1 = &(this->m_returned_char).c.super__Deque_base<char,_std::allocator<char>_>._M_impl
                    .super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
      }
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool is_new_line( typename Trait::char_t & ch )
	{
		if( ch == const_t< Trait >::c_carriage_return )
			return true;
		else if( ch == const_t< Trait >::c_line_feed )
		{
			typename Trait::char_t next_char( 0x00 );

			next_char = simple_get();

			if( next_char == const_t< Trait >::c_carriage_return )
			{
				ch = next_char;

				return true;
			}
			else
			{
				m_returned_char.push( next_char );

				return true;
			}
		}
		else
			return false;
	}